

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

AActor * P_CheckOnmobj(AActor *thing)

{
  AActor *local_30;
  AActor *local_28;
  AActor *onmobj;
  double dStack_18;
  bool good;
  double oldz;
  AActor *thing_local;
  
  oldz = (double)thing;
  dStack_18 = AActor::Z(thing);
  P_FakeZMovement((AActor *)oldz);
  onmobj._7_1_ = P_TestMobjZ((AActor *)oldz,false,&local_28);
  AActor::SetZ((AActor *)oldz,dStack_18,true);
  if ((onmobj._7_1_ & 1) == 0) {
    local_30 = local_28;
  }
  else {
    local_30 = (AActor *)0x0;
  }
  return local_30;
}

Assistant:

AActor *P_CheckOnmobj(AActor *thing)
{
	double oldz;
	bool good;
	AActor *onmobj;

	oldz = thing->Z();
	P_FakeZMovement(thing);
	good = P_TestMobjZ(thing, false, &onmobj);
	thing->SetZ(oldz);

	return good ? NULL : onmobj;
}